

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry * NscBuildStructDeclaratorList(CNscPStackEntry *pList,CNscPStackEntry *pDeclarator)

{
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  CNwnDoubleLinkList *pCVar4;
  CNwnDoubleLinkList *pNext;
  
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    if (pList->m_nType != NscType_Unknown) {
      __assert_fail("m_nType == NscType_Unknown",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0xee,"void CNscPStackEntry::SetType(NscType)");
    }
  }
  else if (pList->m_nType == NscType_Error) goto LAB_0014b775;
  CNscPStackEntry::PushDeclaration
            (pList,pDeclarator->m_pszId,NscType_Unknown,(uchar *)0x0,0,g_pCtx->m_anFileNumbers[0],
             g_pCtx->m_anLineNumbers[0],0);
LAB_0014b775:
  pCVar3 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pDeclarator->m_link).m_pNext;
  if (pCVar2 != pDeclarator) {
    pCVar4 = (pDeclarator->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pDeclarator->m_link).m_pNext = &pDeclarator->m_link;
  }
  pCVar4 = &pCVar3->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pDeclarator) {
    pCVar4 = pCVar1;
  }
  pCVar1 = pCVar4->m_pNext;
  (pDeclarator->m_link).m_pNext = pCVar1;
  (pDeclarator->m_link).m_pPrev = pCVar4;
  pCVar4->m_pNext = &pDeclarator->m_link;
  pCVar1->m_pPrev = &pDeclarator->m_link;
  return pList;
}

Assistant:

YYSTYPE NscBuildStructDeclaratorList (YYSTYPE pList, YYSTYPE pDeclarator)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the parameter
	//

	if (pOut ->GetType () != NscType_Error)
	{
		pOut ->PushDeclaration (pDeclarator ->GetIdentifier (),
			NscType_Unknown, NULL, 0, g_pCtx ->GetFile (0),
			g_pCtx ->GetLine (0), 0);
	}
	g_pCtx ->FreePStackEntry (pDeclarator);


	//
	// Return the new expression
	//

	return pOut;
}